

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O1

void __thiscall
sf::priv::GlxContext::updateSettingsFromVisualInfo(GlxContext *this,XVisualInfo *visualInfo)

{
  int sRgb;
  int samples;
  int multiSampling;
  int stencil;
  int depth;
  int local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  glXGetConfig(this->m_display,visualInfo,0xc,&local_14);
  glXGetConfig(this->m_display,visualInfo,0xd,&local_18);
  if (sfglx_ext_ARB_multisample == 1) {
    glXGetConfig(this->m_display,visualInfo,100000,&local_1c);
    glXGetConfig(this->m_display,visualInfo,0x186a1,&local_20);
  }
  else {
    local_1c = 0;
    local_20 = 0;
  }
  if ((sfglx_ext_EXT_framebuffer_sRGB == 1) || (sfglx_ext_ARB_framebuffer_sRGB == 1)) {
    glXGetConfig(this->m_display,visualInfo,0x20b2,&local_24);
  }
  else {
    local_24 = 0;
  }
  (this->super_GlContext).m_settings.depthBits = local_14;
  (this->super_GlContext).m_settings.stencilBits = local_18;
  if (local_1c != 0) {
    local_1c = local_20;
  }
  (this->super_GlContext).m_settings.antialiasingLevel = local_1c;
  (this->super_GlContext).m_settings.sRgbCapable = local_24 == 1;
  return;
}

Assistant:

void GlxContext::updateSettingsFromVisualInfo(XVisualInfo* visualInfo)
{
    // Update the creation settings from the chosen format
    int depth, stencil, multiSampling, samples, sRgb;
    glXGetConfig(m_display, visualInfo, GLX_DEPTH_SIZE,   &depth);
    glXGetConfig(m_display, visualInfo, GLX_STENCIL_SIZE, &stencil);

    if (sfglx_ext_ARB_multisample == sfglx_LOAD_SUCCEEDED)
    {
        glXGetConfig(m_display, visualInfo, GLX_SAMPLE_BUFFERS_ARB, &multiSampling);
        glXGetConfig(m_display, visualInfo, GLX_SAMPLES_ARB,        &samples);
    }
    else
    {
        multiSampling = 0;
        samples = 0;
    }

    if ((sfglx_ext_EXT_framebuffer_sRGB == sfglx_LOAD_SUCCEEDED) || (sfglx_ext_ARB_framebuffer_sRGB == sfglx_LOAD_SUCCEEDED))
    {
        glXGetConfig(m_display, visualInfo, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &sRgb);
    }
    else
    {
        sRgb = 0;
    }

    m_settings.depthBits         = static_cast<unsigned int>(depth);
    m_settings.stencilBits       = static_cast<unsigned int>(stencil);
    m_settings.antialiasingLevel = multiSampling ? samples : 0;
    m_settings.sRgbCapable       = (sRgb == True);
}